

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_v_wasm.cpp
# Opt level: O0

JsType wasm::wasmToJsType(Type type)

{
  bool bVar1;
  BasicType BVar2;
  Type local_18;
  Type type_local;
  
  local_18.id = type.id;
  bVar1 = Type::isTuple(&local_18);
  if (bVar1) {
    __assert_fail("!type.isTuple() && \"Unexpected tuple type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/asmjs/asm_v_wasm.cpp"
                  ,0x18,"JsType wasm::wasmToJsType(Type)");
  }
  bVar1 = Type::isBasic(&local_18);
  if (bVar1) {
    BVar2 = Type::getBasic(&local_18);
    switch(BVar2) {
    case none:
      type_local.id._4_4_ = JS_NONE;
      break;
    case unreachable:
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/asmjs/asm_v_wasm.cpp"
                         ,0x27);
    case i32:
      type_local.id._4_4_ = JS_INT;
      break;
    case i64:
      type_local.id._4_4_ = JS_INT64;
      break;
    case f32:
      type_local.id._4_4_ = JS_FLOAT;
      break;
    case f64:
      type_local.id._4_4_ = JS_DOUBLE;
      break;
    case v128:
      handle_unreachable("v128 not implemented yet",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/asmjs/asm_v_wasm.cpp"
                         ,0x23);
    default:
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/asmjs/asm_v_wasm.cpp"
                         ,0x29);
    }
    return type_local.id._4_4_;
  }
  __assert_fail("type.isBasic() && \"TODO: handle compound types\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/asmjs/asm_v_wasm.cpp"
                ,0x18,"JsType wasm::wasmToJsType(Type)");
}

Assistant:

JsType wasmToJsType(Type type) {
  TODO_SINGLE_COMPOUND(type);
  switch (type.getBasic()) {
    case Type::i32:
      return JS_INT;
    case Type::f32:
      return JS_FLOAT;
    case Type::f64:
      return JS_DOUBLE;
    case Type::i64:
      return JS_INT64;
    case Type::v128:
      WASM_UNREACHABLE("v128 not implemented yet");
    case Type::none:
      return JS_NONE;
    case Type::unreachable:
      WASM_UNREACHABLE("invalid type");
  }
  WASM_UNREACHABLE("invalid type");
}